

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cpp
# Opt level: O0

void __thiscall duration_combinations_Test::TestBody(duration_combinations_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_8a0 [8];
  Message local_898 [12];
  int local_88c;
  duration<long,std::ratio<31556952l,1l>> local_888 [12];
  int local_87c;
  duration<long,std::ratio<86400l,1l>> local_878 [8];
  rep local_870;
  duration<long,_std::ratio<1L,_1L>_> local_868;
  rep local_860;
  duration<long,_std::ratio<1L,_1L>_> local_858;
  rep local_850;
  duration<long,_std::ratio<1L,_1L>_> local_848;
  duration<long,_std::ratio<1L,_1L>_> local_840;
  duration<long,_std::ratio<3600L,_1L>_> local_838;
  duration<long,_std::ratio<1L,_1L>_> local_830;
  duration<long,_std::ratio<60L,_1L>_> local_828;
  int local_81c;
  duration<long,std::ratio<2629746l,1l>> local_818 [12];
  int local_80c;
  duration<long,std::ratio<604800l,1l>> local_808 [12];
  int local_7fc;
  duration<long,std::ratio<86400l,1l>> local_7f8 [8];
  duration<long,_std::ratio<86400L,_1L>_> local_7f0;
  duration<long,_std::ratio<54L,_1L>_> local_7e8;
  duration<long,_std::ratio<6L,_1L>_> local_7e0;
  duration<long,_std::ratio<1L,_1L>_> local_7d8;
  duration<long,_std::ratio<1L,_1L>_> local_7d0;
  duration<long,_std::ratio<1L,_1L>_> local_7c8;
  duration<long,_std::ratio<1L,_1L>_> local_7c0;
  duration<long,_std::ratio<1L,_1L>_> local_7b8;
  duration<long,_std::ratio<1L,_1L>_> local_7b0;
  duration<long,_std::ratio<1L,_1L>_> local_7a8;
  rep local_7a0;
  duration<long,_std::ratio<1L,_1L>_> local_798;
  rep local_790;
  basic_string_view<char,_std::char_traits<char>_> local_788;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_778;
  rep local_768;
  undefined1 local_760 [8];
  AssertionResult gtest_ar_9;
  Message local_748 [8];
  rep local_740;
  duration<long,_std::ratio<1L,_1L>_> local_738;
  rep local_730;
  duration<long,_std::ratio<1L,_1L>_> local_728;
  rep local_720;
  duration<long,_std::ratio<1L,_1L>_> local_718;
  duration<long,_std::ratio<1L,_1L>_> local_710;
  duration<long,_std::ratio<3600L,_1L>_> local_708;
  duration<long,_std::ratio<1L,_1L>_> local_700;
  duration<long,_std::ratio<60L,_1L>_> local_6f8;
  int local_6ec;
  duration<long,std::ratio<2629746l,1l>> local_6e8 [12];
  int local_6dc;
  duration<long,std::ratio<604800l,1l>> local_6d8 [12];
  int local_6cc;
  duration<long,std::ratio<86400l,1l>> local_6c8 [8];
  duration<long,_std::ratio<86400L,_1L>_> local_6c0;
  duration<long,_std::ratio<54L,_1L>_> local_6b8;
  duration<long,_std::ratio<6L,_1L>_> local_6b0;
  duration<long,_std::ratio<1L,_1L>_> local_6a8;
  duration<long,_std::ratio<1L,_1L>_> local_6a0;
  duration<long,_std::ratio<1L,_1L>_> local_698;
  duration<long,_std::ratio<1L,_1L>_> local_690;
  duration<long,_std::ratio<1L,_1L>_> local_688;
  rep local_680;
  duration<long,_std::ratio<1L,_1L>_> local_678;
  rep local_670;
  basic_string_view<char,_std::char_traits<char>_> local_668;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_658;
  rep local_648;
  undefined1 local_640 [8];
  AssertionResult gtest_ar_8;
  Message local_628 [8];
  rep local_620;
  duration<long,_std::ratio<1L,_1L>_> local_618;
  rep local_610;
  duration<long,_std::ratio<1L,_1L>_> local_608;
  duration<long,_std::ratio<1L,_1L>_> local_600;
  duration<long,_std::ratio<3600L,_1L>_> local_5f8;
  duration<long,_std::ratio<1L,_1L>_> local_5f0;
  duration<long,_std::ratio<60L,_1L>_> local_5e8;
  int local_5dc;
  duration<long,std::ratio<2629746l,1l>> local_5d8 [12];
  int local_5cc;
  duration<long,std::ratio<604800l,1l>> local_5c8 [12];
  int local_5bc;
  duration<long,std::ratio<86400l,1l>> local_5b8 [8];
  duration<long,_std::ratio<86400L,_1L>_> local_5b0;
  duration<long,_std::ratio<54L,_1L>_> local_5a8;
  duration<long,_std::ratio<6L,_1L>_> local_5a0;
  duration<long,_std::ratio<1L,_1L>_> local_598;
  duration<long,_std::ratio<1L,_1L>_> local_590;
  duration<long,_std::ratio<1L,_1L>_> local_588;
  duration<long,_std::ratio<1L,_1L>_> local_580;
  rep local_578;
  duration<long,_std::ratio<1L,_1L>_> local_570;
  rep local_568;
  basic_string_view<char,_std::char_traits<char>_> local_560;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_550;
  rep local_540;
  undefined1 local_538 [8];
  AssertionResult gtest_ar_7;
  Message local_520 [8];
  rep local_518;
  duration<long,_std::ratio<1L,_1L>_> local_510;
  duration<long,_std::ratio<1L,_1L>_> local_508;
  duration<long,_std::ratio<3600L,_1L>_> local_500;
  duration<long,_std::ratio<1L,_1L>_> local_4f8;
  duration<long,_std::ratio<60L,_1L>_> local_4f0;
  int local_4e4;
  duration<long,std::ratio<2629746l,1l>> local_4e0 [12];
  int local_4d4;
  duration<long,std::ratio<604800l,1l>> local_4d0 [12];
  int local_4c4;
  duration<long,std::ratio<86400l,1l>> local_4c0 [8];
  duration<long,_std::ratio<86400L,_1L>_> local_4b8;
  duration<long,_std::ratio<54L,_1L>_> local_4b0;
  duration<long,_std::ratio<6L,_1L>_> local_4a8;
  duration<long,_std::ratio<1L,_1L>_> local_4a0;
  duration<long,_std::ratio<1L,_1L>_> local_498;
  duration<long,_std::ratio<1L,_1L>_> local_490;
  rep local_488;
  duration<long,_std::ratio<1L,_1L>_> local_480;
  rep local_478;
  basic_string_view<char,_std::char_traits<char>_> local_470;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_460;
  rep local_450;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_6;
  Message local_430 [8];
  duration<long,_std::ratio<1L,_1L>_> local_428;
  duration<long,_std::ratio<3600L,_1L>_> local_420;
  duration<long,_std::ratio<1L,_1L>_> local_418;
  duration<long,_std::ratio<60L,_1L>_> local_410;
  int local_404;
  duration<long,std::ratio<2629746l,1l>> local_400 [12];
  int local_3f4;
  duration<long,std::ratio<604800l,1l>> local_3f0 [12];
  int local_3e4;
  duration<long,std::ratio<86400l,1l>> local_3e0 [8];
  duration<long,_std::ratio<86400L,_1L>_> local_3d8;
  duration<long,_std::ratio<54L,_1L>_> local_3d0;
  duration<long,_std::ratio<6L,_1L>_> local_3c8;
  duration<long,_std::ratio<1L,_1L>_> local_3c0;
  duration<long,_std::ratio<1L,_1L>_> local_3b8;
  rep local_3b0;
  duration<long,_std::ratio<1L,_1L>_> local_3a8;
  rep local_3a0;
  basic_string_view<char,_std::char_traits<char>_> local_398;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_388;
  rep local_378;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_5;
  Message local_358 [8];
  duration<long,_std::ratio<3600L,_1L>_> local_350;
  duration<long,_std::ratio<1L,_1L>_> local_348;
  duration<long,_std::ratio<60L,_1L>_> local_340;
  int local_334;
  duration<long,std::ratio<2629746l,1l>> local_330 [12];
  int local_324;
  duration<long,std::ratio<604800l,1l>> local_320 [12];
  int local_314;
  duration<long,std::ratio<86400l,1l>> local_310 [8];
  duration<long,_std::ratio<86400L,_1L>_> local_308;
  duration<long,_std::ratio<54L,_1L>_> local_300;
  duration<long,_std::ratio<6L,_1L>_> local_2f8;
  duration<long,_std::ratio<1L,_1L>_> local_2f0;
  rep local_2e8;
  duration<long,_std::ratio<1L,_1L>_> local_2e0;
  rep local_2d8;
  basic_string_view<char,_std::char_traits<char>_> local_2d0;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_2c0;
  rep local_2b0;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_4;
  Message local_290 [8];
  duration<long,_std::ratio<1L,_1L>_> local_288;
  duration<long,_std::ratio<60L,_1L>_> local_280;
  int local_274;
  duration<long,std::ratio<2629746l,1l>> local_270 [12];
  int local_264;
  duration<long,std::ratio<604800l,1l>> local_260 [12];
  int local_254;
  duration<long,std::ratio<86400l,1l>> local_250 [8];
  duration<long,_std::ratio<86400L,_1L>_> local_248;
  duration<long,_std::ratio<54L,_1L>_> local_240;
  duration<long,_std::ratio<6L,_1L>_> local_238;
  rep local_230;
  duration<long,_std::ratio<1L,_1L>_> local_228;
  rep local_220;
  basic_string_view<char,_std::char_traits<char>_> local_218;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_208;
  rep local_1f8;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_3;
  Message local_1d8 [8];
  duration<long,_std::ratio<60L,_1L>_> local_1d0;
  int local_1c4;
  duration<long,std::ratio<2629746l,1l>> local_1c0 [12];
  int local_1b4;
  duration<long,std::ratio<604800l,1l>> local_1b0 [12];
  int local_1a4;
  duration<long,std::ratio<86400l,1l>> local_1a0 [8];
  duration<long,_std::ratio<86400L,_1L>_> local_198;
  duration<long,_std::ratio<54L,_1L>_> local_190;
  rep local_188;
  duration<long,_std::ratio<1L,_1L>_> local_180;
  rep local_178;
  basic_string_view<char,_std::char_traits<char>_> local_170;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_160;
  rep local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_2;
  Message local_130 [12];
  int local_124;
  duration<long,std::ratio<2629746l,1l>> local_120 [12];
  int local_114;
  duration<long,std::ratio<604800l,1l>> local_110 [12];
  int local_104;
  duration<long,std::ratio<86400l,1l>> local_100 [8];
  duration<long,_std::ratio<86400L,_1L>_> local_f8;
  rep local_f0;
  duration<long,_std::ratio<1L,_1L>_> local_e8;
  rep local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_c8;
  rep local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98 [28];
  int local_7c;
  duration<long,std::ratio<604800l,1l>> local_78 [12];
  int local_6c;
  duration<long,std::ratio<86400l,1l>> local_68 [8];
  rep local_60;
  duration<long,_std::ratio<1L,_1L>_> local_58;
  rep local_50;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_38;
  rep local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  duration_combinations_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_48 = sv("1d 4 weeks",10);
  local_38 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                       (&local_48);
  local_28 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_38.duration);
  local_6c = 1;
  std::chrono::duration<long,std::ratio<86400l,1l>>::duration<int,void>(local_68,&local_6c);
  local_7c = 4;
  std::chrono::duration<long,std::ratio<604800l,1l>>::duration<int,void>(local_78,&local_7c);
  local_60 = (rep)std::chrono::operator+
                            ((duration<long,_std::ratio<86400L,_1L>_> *)local_68,
                             (duration<long,_std::ratio<604800L,_1L>_> *)local_78);
  local_58.__r = (rep)to_seconds<std::chrono::duration<long,std::ratio<86400l,1l>>>
                                ((duration<long,_std::ratio<86400L,_1L>_>)local_60);
  local_50 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_58);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_20,"duration_from_string(\"1d 4 weeks\"sv).duration.count()",
             "to_seconds(days{1} + weeks{4}).count()",&local_28,&local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0xc3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_d8 = sv("1d 4 weeks 1 mon",0x10);
  local_c8 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                       (&local_d8);
  local_b8 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_c8.duration);
  local_104 = 1;
  std::chrono::duration<long,std::ratio<86400l,1l>>::duration<int,void>(local_100,&local_104);
  local_114 = 4;
  std::chrono::duration<long,std::ratio<604800l,1l>>::duration<int,void>(local_110,&local_114);
  local_f8.__r = (rep)std::chrono::operator+
                                ((duration<long,_std::ratio<86400L,_1L>_> *)local_100,
                                 (duration<long,_std::ratio<604800L,_1L>_> *)local_110);
  local_124 = 1;
  std::chrono::duration<long,std::ratio<2629746l,1l>>::duration<int,void>(local_120,&local_124);
  local_f0 = (rep)std::chrono::operator+
                            (&local_f8,(duration<long,_std::ratio<2629746L,_1L>_> *)local_120);
  local_e8.__r = (rep)to_seconds<std::chrono::duration<long,std::ratio<54l,1l>>>
                                ((duration<long,_std::ratio<54L,_1L>_>)local_f0);
  local_e0 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_e8);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_b0,"duration_from_string(\"1d 4 weeks 1 mon\"sv).duration.count()",
             "to_seconds(days{1} + weeks{4} + months{1}).count()",&local_b8,&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0xc5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_170 = sv("1d 4 weeks 1 mon 4 min",0x16);
  local_160 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_170);
  local_150 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_160.duration);
  local_1a4 = 1;
  std::chrono::duration<long,std::ratio<86400l,1l>>::duration<int,void>(local_1a0,&local_1a4);
  local_1b4 = 4;
  std::chrono::duration<long,std::ratio<604800l,1l>>::duration<int,void>(local_1b0,&local_1b4);
  local_198.__r =
       (rep)std::chrono::operator+
                      ((duration<long,_std::ratio<86400L,_1L>_> *)local_1a0,
                       (duration<long,_std::ratio<604800L,_1L>_> *)local_1b0);
  local_1c4 = 1;
  std::chrono::duration<long,std::ratio<2629746l,1l>>::duration<int,void>(local_1c0,&local_1c4);
  local_190.__r =
       (rep)std::chrono::operator+
                      (&local_198,(duration<long,_std::ratio<2629746L,_1L>_> *)local_1c0);
  local_1d0.__r = (rep)min<(char)52>();
  local_188 = (rep)std::chrono::operator+(&local_190,&local_1d0);
  local_180.__r =
       (rep)to_seconds<std::chrono::duration<long,std::ratio<6l,1l>>>
                      ((duration<long,_std::ratio<6L,_1L>_>)local_188);
  local_178 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_180);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_148,
             "duration_from_string(\"1d 4 weeks 1 mon 4 min\"sv).duration.count()",
             "to_seconds(days{1} + weeks{4} + months{1} + 4min).count()",&local_150,&local_178);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(local_1d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,199,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  local_218 = sv("1d 4 weeks 1 mon 4 min 36 sec",0x1d);
  local_208 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_218);
  local_1f8 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_208.duration);
  local_254 = 1;
  std::chrono::duration<long,std::ratio<86400l,1l>>::duration<int,void>(local_250,&local_254);
  local_264 = 4;
  std::chrono::duration<long,std::ratio<604800l,1l>>::duration<int,void>(local_260,&local_264);
  local_248.__r =
       (rep)std::chrono::operator+
                      ((duration<long,_std::ratio<86400L,_1L>_> *)local_250,
                       (duration<long,_std::ratio<604800L,_1L>_> *)local_260);
  local_274 = 1;
  std::chrono::duration<long,std::ratio<2629746l,1l>>::duration<int,void>(local_270,&local_274);
  local_240.__r =
       (rep)std::chrono::operator+
                      (&local_248,(duration<long,_std::ratio<2629746L,_1L>_> *)local_270);
  local_280.__r = (rep)min<(char)52>();
  local_238.__r = (rep)std::chrono::operator+(&local_240,&local_280);
  local_288.__r = (rep)s<(char)51,(char)54>();
  local_230 = (rep)std::chrono::operator+(&local_238,&local_288);
  local_228.__r =
       (rep)to_seconds<std::chrono::duration<long,std::ratio<1l,1l>>>
                      ((duration<long,_std::ratio<1L,_1L>_>)local_230);
  local_220 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_228);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_1f0,
             "duration_from_string(\"1d 4 weeks 1 mon 4 min 36 sec\"sv).duration.count()",
             "to_seconds(days{1} + weeks{4} + months{1} + 4min + 36s).count()",&local_1f8,&local_220
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(local_290);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0xc9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  local_2d0 = sv("1d 4 weeks 1 mon 4 min 36 sec 12hr",0x22);
  local_2c0 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_2d0);
  local_2b0 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_2c0.duration);
  local_314 = 1;
  std::chrono::duration<long,std::ratio<86400l,1l>>::duration<int,void>(local_310,&local_314);
  local_324 = 4;
  std::chrono::duration<long,std::ratio<604800l,1l>>::duration<int,void>(local_320,&local_324);
  local_308.__r =
       (rep)std::chrono::operator+
                      ((duration<long,_std::ratio<86400L,_1L>_> *)local_310,
                       (duration<long,_std::ratio<604800L,_1L>_> *)local_320);
  local_334 = 1;
  std::chrono::duration<long,std::ratio<2629746l,1l>>::duration<int,void>(local_330,&local_334);
  local_300.__r =
       (rep)std::chrono::operator+
                      (&local_308,(duration<long,_std::ratio<2629746L,_1L>_> *)local_330);
  local_340.__r = (rep)min<(char)52>();
  local_2f8.__r = (rep)std::chrono::operator+(&local_300,&local_340);
  local_348.__r = (rep)s<(char)51,(char)54>();
  local_2f0.__r = (rep)std::chrono::operator+(&local_2f8,&local_348);
  local_350.__r = (rep)h<(char)49,(char)50>();
  local_2e8 = (rep)std::chrono::operator+(&local_2f0,&local_350);
  local_2e0.__r =
       (rep)to_seconds<std::chrono::duration<long,std::ratio<1l,1l>>>
                      ((duration<long,_std::ratio<1L,_1L>_>)local_2e8);
  local_2d8 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_2e0);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_2a8,
             "duration_from_string(\"1d 4 weeks 1 mon 4 min 36 sec 12hr\"sv).duration.count()",
             "to_seconds(days{1} + weeks{4} + months{1} + 4min + 36s + 12h).count()",&local_2b0,
             &local_2d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(local_358);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0xcb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  local_398 = sv("1d 4 weeks 1 mon 4 min 36 sec 12hr 5s",0x25);
  local_388 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_398);
  local_378 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_388.duration);
  local_3e4 = 1;
  std::chrono::duration<long,std::ratio<86400l,1l>>::duration<int,void>(local_3e0,&local_3e4);
  local_3f4 = 4;
  std::chrono::duration<long,std::ratio<604800l,1l>>::duration<int,void>(local_3f0,&local_3f4);
  local_3d8.__r =
       (rep)std::chrono::operator+
                      ((duration<long,_std::ratio<86400L,_1L>_> *)local_3e0,
                       (duration<long,_std::ratio<604800L,_1L>_> *)local_3f0);
  local_404 = 1;
  std::chrono::duration<long,std::ratio<2629746l,1l>>::duration<int,void>(local_400,&local_404);
  local_3d0.__r =
       (rep)std::chrono::operator+
                      (&local_3d8,(duration<long,_std::ratio<2629746L,_1L>_> *)local_400);
  local_410.__r = (rep)min<(char)52>();
  local_3c8.__r = (rep)std::chrono::operator+(&local_3d0,&local_410);
  local_418.__r = (rep)s<(char)51,(char)54>();
  local_3c0.__r = (rep)std::chrono::operator+(&local_3c8,&local_418);
  local_420.__r = (rep)h<(char)49,(char)50>();
  local_3b8.__r = (rep)std::chrono::operator+(&local_3c0,&local_420);
  local_428.__r = (rep)s<(char)53>();
  local_3b0 = (rep)std::chrono::operator+(&local_3b8,&local_428);
  local_3a8.__r =
       (rep)to_seconds<std::chrono::duration<long,std::ratio<1l,1l>>>
                      ((duration<long,_std::ratio<1L,_1L>_>)local_3b0);
  local_3a0 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_3a8);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_370,
             "duration_from_string(\"1d 4 weeks 1 mon 4 min 36 sec 12hr 5s\"sv).duration.count()",
             "to_seconds(days{1} + weeks{4} + months{1} + 4min + 36s + 12h + 5s).count()",&local_378
             ,&local_3a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(local_430);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0xcd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  local_470 = sv("1d 4 weeks 1 mon 4 min 36 sec 12hr 5s 4900ms",0x2c);
  local_460 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_470);
  local_450 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_460.duration);
  local_4c4 = 1;
  std::chrono::duration<long,std::ratio<86400l,1l>>::duration<int,void>(local_4c0,&local_4c4);
  local_4d4 = 4;
  std::chrono::duration<long,std::ratio<604800l,1l>>::duration<int,void>(local_4d0,&local_4d4);
  local_4b8.__r =
       (rep)std::chrono::operator+
                      ((duration<long,_std::ratio<86400L,_1L>_> *)local_4c0,
                       (duration<long,_std::ratio<604800L,_1L>_> *)local_4d0);
  local_4e4 = 1;
  std::chrono::duration<long,std::ratio<2629746l,1l>>::duration<int,void>(local_4e0,&local_4e4);
  local_4b0.__r =
       (rep)std::chrono::operator+
                      (&local_4b8,(duration<long,_std::ratio<2629746L,_1L>_> *)local_4e0);
  local_4f0.__r = (rep)min<(char)52>();
  local_4a8.__r = (rep)std::chrono::operator+(&local_4b0,&local_4f0);
  local_4f8.__r = (rep)s<(char)51,(char)54>();
  local_4a0.__r = (rep)std::chrono::operator+(&local_4a8,&local_4f8);
  local_500.__r = (rep)h<(char)49,(char)50>();
  local_498.__r = (rep)std::chrono::operator+(&local_4a0,&local_500);
  local_508.__r = (rep)s<(char)53>();
  local_490.__r = (rep)std::chrono::operator+(&local_498,&local_508);
  local_518 = (rep)ms<(char)52,(char)57,(char)48,(char)48>();
  local_510.__r =
       (rep)to_seconds<std::chrono::duration<long,std::ratio<1l,1000l>>>
                      ((duration<long,_std::ratio<1L,_1000L>_>)local_518);
  local_488 = (rep)std::chrono::operator+(&local_490,&local_510);
  local_480.__r =
       (rep)to_seconds<std::chrono::duration<long,std::ratio<1l,1l>>>
                      ((duration<long,_std::ratio<1L,_1L>_>)local_488);
  local_478 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_480);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_448,
             "duration_from_string(\"1d 4 weeks 1 mon 4 min 36 sec 12hr 5s 4900ms\"sv).duration.count()"
             ,
             "to_seconds(days{1} + weeks{4} + months{1} + 4min + 36s + 12h + 5s + to_seconds(4900ms)).count()"
             ,&local_450,&local_478);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(local_520);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0xd1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_520);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(local_520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  local_560 = sv("1d 4 weeks 1 mon 4 min 36 sec 12hr 5s 4900ms 6900000us",0x36);
  local_550 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_560);
  local_540 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_550.duration);
  local_5bc = 1;
  std::chrono::duration<long,std::ratio<86400l,1l>>::duration<int,void>(local_5b8,&local_5bc);
  local_5cc = 4;
  std::chrono::duration<long,std::ratio<604800l,1l>>::duration<int,void>(local_5c8,&local_5cc);
  local_5b0.__r =
       (rep)std::chrono::operator+
                      ((duration<long,_std::ratio<86400L,_1L>_> *)local_5b8,
                       (duration<long,_std::ratio<604800L,_1L>_> *)local_5c8);
  local_5dc = 1;
  std::chrono::duration<long,std::ratio<2629746l,1l>>::duration<int,void>(local_5d8,&local_5dc);
  local_5a8.__r =
       (rep)std::chrono::operator+
                      (&local_5b0,(duration<long,_std::ratio<2629746L,_1L>_> *)local_5d8);
  local_5e8.__r = (rep)min<(char)52>();
  local_5a0.__r = (rep)std::chrono::operator+(&local_5a8,&local_5e8);
  local_5f0.__r = (rep)s<(char)51,(char)54>();
  local_598.__r = (rep)std::chrono::operator+(&local_5a0,&local_5f0);
  local_5f8.__r = (rep)h<(char)49,(char)50>();
  local_590.__r = (rep)std::chrono::operator+(&local_598,&local_5f8);
  local_600.__r = (rep)s<(char)53>();
  local_588.__r = (rep)std::chrono::operator+(&local_590,&local_600);
  local_610 = (rep)ms<(char)52,(char)57,(char)48,(char)48>();
  local_608.__r =
       (rep)to_seconds<std::chrono::duration<long,std::ratio<1l,1000l>>>
                      ((duration<long,_std::ratio<1L,_1000L>_>)local_610);
  local_580.__r = (rep)std::chrono::operator+(&local_588,&local_608);
  local_620 = (rep)us<(char)54,(char)57,(char)48,(char)48,(char)48,(char)48,(char)48>();
  local_618.__r =
       (rep)to_seconds<std::chrono::duration<long,std::ratio<1l,1000000l>>>
                      ((duration<long,_std::ratio<1L,_1000000L>_>)local_620);
  local_578 = (rep)std::chrono::operator+(&local_580,&local_618);
  local_570.__r =
       (rep)to_seconds<std::chrono::duration<long,std::ratio<1l,1l>>>
                      ((duration<long,_std::ratio<1L,_1L>_>)local_578);
  local_568 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_570);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_538,
             "duration_from_string(\"1d 4 weeks 1 mon 4 min 36 sec 12hr 5s 4900ms 6900000us\"sv).duration.count()"
             ,
             "to_seconds(days{1} + weeks{4} + months{1} + 4min + 36s + 12h + 5s + to_seconds(4900ms) + to_seconds(6900000us)).count()"
             ,&local_540,&local_568);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_538);
  if (!bVar1) {
    testing::Message::Message(local_628);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_538);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0xd3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_628);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
  local_668 = sv("1d 4 weeks 1 mon 4 min 36 sec 12hr 5s 4900ms 6900000us 900000000ns",0x42);
  local_658 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_668);
  local_648 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_658.duration);
  local_6cc = 1;
  std::chrono::duration<long,std::ratio<86400l,1l>>::duration<int,void>(local_6c8,&local_6cc);
  local_6dc = 4;
  std::chrono::duration<long,std::ratio<604800l,1l>>::duration<int,void>(local_6d8,&local_6dc);
  local_6c0.__r =
       (rep)std::chrono::operator+
                      ((duration<long,_std::ratio<86400L,_1L>_> *)local_6c8,
                       (duration<long,_std::ratio<604800L,_1L>_> *)local_6d8);
  local_6ec = 1;
  std::chrono::duration<long,std::ratio<2629746l,1l>>::duration<int,void>(local_6e8,&local_6ec);
  local_6b8.__r =
       (rep)std::chrono::operator+
                      (&local_6c0,(duration<long,_std::ratio<2629746L,_1L>_> *)local_6e8);
  local_6f8.__r = (rep)min<(char)52>();
  local_6b0.__r = (rep)std::chrono::operator+(&local_6b8,&local_6f8);
  local_700.__r = (rep)s<(char)51,(char)54>();
  local_6a8.__r = (rep)std::chrono::operator+(&local_6b0,&local_700);
  local_708.__r = (rep)h<(char)49,(char)50>();
  local_6a0.__r = (rep)std::chrono::operator+(&local_6a8,&local_708);
  local_710.__r = (rep)s<(char)53>();
  local_698.__r = (rep)std::chrono::operator+(&local_6a0,&local_710);
  local_720 = (rep)ms<(char)52,(char)57,(char)48,(char)48>();
  local_718.__r =
       (rep)to_seconds<std::chrono::duration<long,std::ratio<1l,1000l>>>
                      ((duration<long,_std::ratio<1L,_1000L>_>)local_720);
  local_690.__r = (rep)std::chrono::operator+(&local_698,&local_718);
  local_730 = (rep)us<(char)54,(char)57,(char)48,(char)48,(char)48,(char)48,(char)48>();
  local_728.__r =
       (rep)to_seconds<std::chrono::duration<long,std::ratio<1l,1000000l>>>
                      ((duration<long,_std::ratio<1L,_1000000L>_>)local_730);
  local_688.__r = (rep)std::chrono::operator+(&local_690,&local_728);
  local_740 = (rep)ns<(char)57,(char)48,(char)48,(char)48,(char)48,(char)48,(char)48,(char)48,(char)48>
                             ();
  local_738.__r =
       (rep)to_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_>)local_740);
  local_680 = (rep)std::chrono::operator+(&local_688,&local_738);
  local_678.__r =
       (rep)to_seconds<std::chrono::duration<long,std::ratio<1l,1l>>>
                      ((duration<long,_std::ratio<1L,_1L>_>)local_680);
  local_670 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_678);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_640,
             "duration_from_string(\"1d 4 weeks 1 mon 4 min 36 sec 12hr 5s 4900ms 6900000us 900000000ns\"sv).duration.count()"
             ,
             "to_seconds(days{1} + weeks{4} + months{1} + 4min + 36s + 12h + 5s + to_seconds(4900ms) + to_seconds(6900000us) + to_seconds(900000000ns)).count()"
             ,&local_648,&local_670);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(local_748);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0xd5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,local_748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(local_748);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  local_788 = sv("1d 4 weeks 1 mon 4 min 36 sec 12hr 5s 4900ms 6900000us 900000000ns 7days 6years",
                 0x4f);
  local_778 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_788);
  local_768 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_778.duration);
  local_7fc = 1;
  std::chrono::duration<long,std::ratio<86400l,1l>>::duration<int,void>(local_7f8,&local_7fc);
  local_80c = 4;
  std::chrono::duration<long,std::ratio<604800l,1l>>::duration<int,void>(local_808,&local_80c);
  local_7f0.__r =
       (rep)std::chrono::operator+
                      ((duration<long,_std::ratio<86400L,_1L>_> *)local_7f8,
                       (duration<long,_std::ratio<604800L,_1L>_> *)local_808);
  local_81c = 1;
  std::chrono::duration<long,std::ratio<2629746l,1l>>::duration<int,void>(local_818,&local_81c);
  local_7e8.__r =
       (rep)std::chrono::operator+
                      (&local_7f0,(duration<long,_std::ratio<2629746L,_1L>_> *)local_818);
  local_828.__r = (rep)min<(char)52>();
  local_7e0.__r = (rep)std::chrono::operator+(&local_7e8,&local_828);
  local_830.__r = (rep)s<(char)51,(char)54>();
  local_7d8.__r = (rep)std::chrono::operator+(&local_7e0,&local_830);
  local_838.__r = (rep)h<(char)49,(char)50>();
  local_7d0.__r = (rep)std::chrono::operator+(&local_7d8,&local_838);
  local_840.__r = (rep)s<(char)53>();
  local_7c8.__r = (rep)std::chrono::operator+(&local_7d0,&local_840);
  local_850 = (rep)ms<(char)52,(char)57,(char)48,(char)48>();
  local_848.__r =
       (rep)to_seconds<std::chrono::duration<long,std::ratio<1l,1000l>>>
                      ((duration<long,_std::ratio<1L,_1000L>_>)local_850);
  local_7c0.__r = (rep)std::chrono::operator+(&local_7c8,&local_848);
  local_860 = (rep)us<(char)54,(char)57,(char)48,(char)48,(char)48,(char)48,(char)48>();
  local_858.__r =
       (rep)to_seconds<std::chrono::duration<long,std::ratio<1l,1000000l>>>
                      ((duration<long,_std::ratio<1L,_1000000L>_>)local_860);
  local_7b8.__r = (rep)std::chrono::operator+(&local_7c0,&local_858);
  local_870 = (rep)ns<(char)57,(char)48,(char)48,(char)48,(char)48,(char)48,(char)48,(char)48,(char)48>
                             ();
  local_868.__r =
       (rep)to_seconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_>)local_870);
  local_7b0.__r = (rep)std::chrono::operator+(&local_7b8,&local_868);
  local_87c = 7;
  std::chrono::duration<long,std::ratio<86400l,1l>>::duration<int,void>(local_878,&local_87c);
  local_7a8.__r =
       (rep)std::chrono::operator+(&local_7b0,(duration<long,_std::ratio<86400L,_1L>_> *)local_878);
  local_88c = 6;
  std::chrono::duration<long,std::ratio<31556952l,1l>>::duration<int,void>(local_888,&local_88c);
  local_7a0 = (rep)std::chrono::operator+
                             (&local_7a8,(duration<long,_std::ratio<31556952L,_1L>_> *)local_888);
  local_798.__r =
       (rep)to_seconds<std::chrono::duration<long,std::ratio<1l,1l>>>
                      ((duration<long,_std::ratio<1L,_1L>_>)local_7a0);
  local_790 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_798);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_760,
             "duration_from_string(\"1d 4 weeks 1 mon 4 min 36 sec 12hr 5s 4900ms 6900000us 900000000ns 7days 6years\"sv).duration.count()"
             ,
             "to_seconds(days{1} + weeks{4} + months{1} + 4min + 36s + 12h + 5s + to_seconds(4900ms) + to_seconds(6900000us) + to_seconds(900000000ns) + days{7} + years {6}).count()"
             ,&local_768,&local_790);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_760);
  if (!bVar1) {
    testing::Message::Message(local_898);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_760);
    testing::internal::AssertHelper::AssertHelper
              (local_8a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0xd7,pcVar2);
    testing::internal::AssertHelper::operator=(local_8a0,local_898);
    testing::internal::AssertHelper::~AssertHelper(local_8a0);
    testing::Message::~Message(local_898);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_760);
  return;
}

Assistant:

TEST(duration, combinations) {
	EXPECT_EQ(duration_from_string("1d 4 weeks"sv).duration.count(),
		to_seconds(days{1} + weeks{4}).count());
	EXPECT_EQ(duration_from_string("1d 4 weeks 1 mon"sv).duration.count(),
		to_seconds(days{1} + weeks{4} + months{1}).count());
	EXPECT_EQ(duration_from_string("1d 4 weeks 1 mon 4 min"sv).duration.count(),
		to_seconds(days{1} + weeks{4} + months{1} + 4min).count());
	EXPECT_EQ(duration_from_string("1d 4 weeks 1 mon 4 min 36 sec"sv).duration.count(),
		to_seconds(days{1} + weeks{4} + months{1} + 4min + 36s).count());
	EXPECT_EQ(duration_from_string("1d 4 weeks 1 mon 4 min 36 sec 12hr"sv).duration.count(),
		to_seconds(days{1} + weeks{4} + months{1} + 4min + 36s + 12h).count());
	EXPECT_EQ(duration_from_string("1d 4 weeks 1 mon 4 min 36 sec 12hr 5s"sv).duration.count(),
		to_seconds(days{1} + weeks{4} + months{1} + 4min + 36s + 12h + 5s).count());

	// Consider refactoring such that the expressions are equal without usage of to_seconds for types smaller than seconds
	EXPECT_EQ(duration_from_string("1d 4 weeks 1 mon 4 min 36 sec 12hr 5s 4900ms"sv).duration.count(),
		to_seconds(days{1} + weeks{4} + months{1} + 4min + 36s + 12h + 5s + to_seconds(4900ms)).count());
	EXPECT_EQ(duration_from_string("1d 4 weeks 1 mon 4 min 36 sec 12hr 5s 4900ms 6900000us"sv).duration.count(),
		to_seconds(days{1} + weeks{4} + months{1} + 4min + 36s + 12h + 5s + to_seconds(4900ms) + to_seconds(6900000us)).count());
	EXPECT_EQ(duration_from_string("1d 4 weeks 1 mon 4 min 36 sec 12hr 5s 4900ms 6900000us 900000000ns"sv).duration.count(),
		to_seconds(days{1} + weeks{4} + months{1} + 4min + 36s + 12h + 5s + to_seconds(4900ms) + to_seconds(6900000us) + to_seconds(900000000ns)).count());
	EXPECT_EQ(duration_from_string("1d 4 weeks 1 mon 4 min 36 sec 12hr 5s 4900ms 6900000us 900000000ns 7days 6years"sv).duration.count(),
		to_seconds(days{1} + weeks{4} + months{1} + 4min + 36s + 12h + 5s + to_seconds(4900ms) + to_seconds(6900000us) + to_seconds(900000000ns) + days{7} + years {6}).count());
}